

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall
cfgfile::exception_t<cfgfile::string_trait_t>::exception_t
          (exception_t<cfgfile::string_trait_t> *this,string_t *what)

{
  std::logic_error::logic_error(&this->super_logic_error,(string *)what);
  *(undefined ***)this = &PTR__exception_t_00136458;
  std::__cxx11::string::string((string *)&this->m_what,(string *)what);
  return;
}

Assistant:

explicit exception_t( string_trait_t::string_t what )
		:	std::logic_error( what )
		,	m_what( std::move( what ) )
	{
	}